

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O2

void __thiscall
asio::detail::executor_function::
executor_function<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>,std::allocator<void>>
          (executor_function *this,
          binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
          *f,allocator<void> *a)

{
  impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>
  *piVar1;
  ptr local_38;
  
  local_38.a = a;
  piVar1 = impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>
           ::ptr::allocate(a);
  local_38.p = (impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>
                *)0x0;
  binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>::binder1
            (&(piVar1->function_).handler_,&f->handler_);
  (piVar1->super_impl_base).complete_ =
       complete<asio::detail::binder0<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>,std::allocator<void>>
  ;
  this->impl_ = (impl_base *)piVar1;
  local_38.v = (void *)0x0;
  impl<asio::detail::binder0<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>,_std::allocator<void>_>
  ::ptr::~ptr(&local_38);
  return;
}

Assistant:

explicit executor_function(F f, const Alloc& a)
  {
    // Allocate and construct an object to wrap the function.
    typedef impl<F, Alloc> impl_type;
    typename impl_type::ptr p = {
      detail::addressof(a), impl_type::ptr::allocate(a), 0 };
    impl_ = new (p.v) impl_type(static_cast<F&&>(f), a);
    p.v = 0;
  }